

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DoWhileStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DoWhileStatementSyntax,slang::syntax::DoWhileStatementSyntax_const&>
          (BumpAllocator *this,DoWhileStatementSyntax *args)

{
  DoWhileStatementSyntax *this_00;
  
  this_00 = (DoWhileStatementSyntax *)allocate(this,0xb8,8);
  slang::syntax::DoWhileStatementSyntax::DoWhileStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }